

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_collapse_rail.cpp
# Opt level: O0

void Omega_h::find_rails(Mesh *mesh,LOs *keys2verts,Read<long> *verts2rail,LOs *rails2edges,
                        Read<signed_char> *rail_col_dirs)

{
  void **__return_storage_ptr__;
  LO LVar1;
  Write<signed_char> local_208;
  Read<signed_char> local_1f8;
  Write<int> local_1e8;
  Read<int> local_1d8;
  undefined1 local_1c8 [8];
  type f;
  Read<long> edge_globals;
  string local_130 [32];
  undefined1 local_110 [8];
  Write<signed_char> rail_col_dirs_w;
  string local_f8 [32];
  undefined1 local_d8 [8];
  Write<int> rails2edges_w;
  Read<signed_char> ve_codes;
  LOs ve2e;
  undefined1 local_98 [8];
  LOs v2ve;
  Adj v2e;
  LO nkeys;
  Read<signed_char> *rail_col_dirs_local;
  LOs *rails2edges_local;
  Read<long> *verts2rail_local;
  LOs *keys2verts_local;
  Mesh *mesh_local;
  ulong local_10;
  
  if (((ulong)(keys2verts->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((keys2verts->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(keys2verts->write_).shared_alloc_.alloc >> 3;
  }
  v2e.codes.write_.shared_alloc_.direct_ptr._4_4_ = (LO)(local_10 >> 2);
  __return_storage_ptr__ = &v2ve.write_.shared_alloc_.direct_ptr;
  Mesh::ask_up((Adj *)__return_storage_ptr__,mesh,0,1);
  Read<int>::Read((Read<int> *)local_98,(Read<int> *)__return_storage_ptr__);
  Read<int>::Read((Read<int> *)&ve_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&v2e.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&rails2edges_w.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&v2e.super_Graph.ab2b.write_.shared_alloc_.direct_ptr);
  LVar1 = v2e.codes.write_.shared_alloc_.direct_ptr._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f8,"",(allocator *)((long)&rail_col_dirs_w.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_d8,LVar1,-1,(string *)local_f8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&rail_col_dirs_w.shared_alloc_.direct_ptr + 7));
  LVar1 = v2e.codes.write_.shared_alloc_.direct_ptr._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,"",(allocator *)((long)&edge_globals.write_.shared_alloc_.direct_ptr + 7));
  Write<signed_char>::Write((Write<signed_char> *)local_110,LVar1,-1,(string *)local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&edge_globals.write_.shared_alloc_.direct_ptr + 7));
  Mesh::globals((Mesh *)&f.rail_col_dirs_w.shared_alloc_.direct_ptr,(Int)mesh);
  Read<int>::Read((Read<int> *)local_1c8,keys2verts);
  Read<long>::Read((Read<long> *)&f.keys2verts.write_.shared_alloc_.direct_ptr,
                   (Read<int> *)verts2rail);
  Read<int>::Read((Read<int> *)&f.verts2rail.write_.shared_alloc_.direct_ptr,(Read<int> *)local_98);
  Read<int>::Read((Read<int> *)&f.v2ve.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&ve_codes.write_.shared_alloc_.direct_ptr);
  Read<long>::Read((Read<long> *)&f.ve2e.write_.shared_alloc_.direct_ptr,
                   (Read<int> *)&f.rail_col_dirs_w.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.edge_globals.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&rails2edges_w.shared_alloc_.direct_ptr);
  Write<int>::Write((Write<int> *)&f.ve_codes.write_.shared_alloc_.direct_ptr,(Write<int> *)local_d8
                   );
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.rails2edges_w.shared_alloc_.direct_ptr,
             (Write<signed_char> *)local_110);
  parallel_for<Omega_h::find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)::__0>
            (v2e.codes.write_.shared_alloc_.direct_ptr._4_4_,(type *)local_1c8,"find_rails");
  Write<int>::Write(&local_1e8,(Write<int> *)local_d8);
  Read<int>::Read(&local_1d8,&local_1e8);
  Read<int>::operator=(rails2edges,&local_1d8);
  Read<int>::~Read(&local_1d8);
  Write<int>::~Write(&local_1e8);
  Write<signed_char>::Write(&local_208,(Write<signed_char> *)local_110);
  Read<signed_char>::Read(&local_1f8,&local_208);
  Read<signed_char>::operator=(rail_col_dirs,&local_1f8);
  Read<signed_char>::~Read(&local_1f8);
  Write<signed_char>::~Write(&local_208);
  find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)
  ::$_0::~__0((__0 *)local_1c8);
  Read<long>::~Read((Read<long> *)&f.rail_col_dirs_w.shared_alloc_.direct_ptr);
  Write<signed_char>::~Write((Write<signed_char> *)local_110);
  Write<int>::~Write((Write<int> *)local_d8);
  Read<signed_char>::~Read((Read<signed_char> *)&rails2edges_w.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&ve_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_98);
  Adj::~Adj((Adj *)&v2ve.write_.shared_alloc_.direct_ptr);
  return;
}

Assistant:

void find_rails(Mesh* mesh, LOs keys2verts, Read<GO> verts2rail,
    LOs* rails2edges, Read<I8>* rail_col_dirs) {
  auto nkeys = keys2verts.size();
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto v2ve = v2e.a2ab;
  auto ve2e = v2e.ab2b;
  auto ve_codes = v2e.codes;
  auto rails2edges_w = Write<LO>(nkeys, -1);
  auto rail_col_dirs_w = Write<I8>(nkeys, -1);
  auto edge_globals = mesh->globals(EDGE);
  auto f = OMEGA_H_LAMBDA(LO key) {
    auto v = keys2verts[key];
    auto rail_global = verts2rail[v];
    for (auto ve = v2ve[v]; ve < v2ve[v + 1]; ++ve) {
      auto e = ve2e[ve];
      auto edge_global = edge_globals[e];
      if (edge_global == rail_global) {
        auto ve_code = ve_codes[ve];
        auto eev = code_which_down(ve_code);
        rails2edges_w[key] = e;
        rail_col_dirs_w[key] = static_cast<I8>(eev);
        return;
      }
    }
    OMEGA_H_NORETURN();
  };
  parallel_for(nkeys, f, "find_rails");
  *rails2edges = rails2edges_w;
  *rail_col_dirs = rail_col_dirs_w;
}